

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

QAbstractButton * __thiscall
QMessageBoxPrivate::abstractButtonForId(QMessageBoxPrivate *this,int id)

{
  StandardButton which;
  QAbstractButton *pQVar1;
  QPushButton *pQVar2;
  
  if (((ulong)(this->customButtonList).d.size <= (ulong)(long)id) ||
     (pQVar1 = (this->customButtonList).d.ptr[id], pQVar1 == (QAbstractButton *)0x0)) {
    pQVar1 = (QAbstractButton *)0x0;
    if ((id & 0x300U) == 0) {
      which = NoButton;
      if (0x3fe < id - 1U) {
        which = id;
      }
      pQVar2 = QDialogButtonBox::button
                         (*(QDialogButtonBox **)
                           (*(long *)(*(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.
                                                field_0x8 + 8) + 0x2f8),which);
      return &pQVar2->super_QAbstractButton;
    }
  }
  return pQVar1;
}

Assistant:

QAbstractButton *QMessageBoxPrivate::abstractButtonForId(int id) const
{
    Q_Q(const QMessageBox);
    QAbstractButton *result = customButtonList.value(id);
    if (result)
        return result;
    if (id & QMessageBox::FlagMask)    // for compatibility with Qt 4.0/4.1 (even if it is silly)
        return nullptr;
    return q->button(newButton(id));
}